

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,char *value)

{
  int32 iVar1;
  int iVar2;
  size_t value_00;
  uint64 length;
  char *value_local;
  uint64 type_local;
  IMkvWriter *writer_local;
  
  if ((writer == (IMkvWriter *)0x0) || (value == (char *)0x0)) {
    writer_local._7_1_ = false;
  }
  else {
    iVar1 = WriteID(writer,type);
    if (iVar1 == 0) {
      value_00 = strlen(value);
      iVar1 = WriteUInt(writer,value_00);
      if (iVar1 == 0) {
        iVar2 = (**writer->_vptr_IMkvWriter)(writer,value,value_00 & 0xffffffff);
        if (iVar2 == 0) {
          writer_local._7_1_ = true;
        }
        else {
          writer_local._7_1_ = false;
        }
      }
      else {
        writer_local._7_1_ = false;
      }
    }
    else {
      writer_local._7_1_ = false;
    }
  }
  return writer_local._7_1_;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, const char* value) {
  if (!writer || !value)
    return false;

  if (WriteID(writer, type))
    return false;

  const uint64 length = strlen(value);
  if (WriteUInt(writer, length))
    return false;

  if (writer->Write(value, static_cast<uint32>(length)))
    return false;

  return true;
}